

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O0

bool __thiscall
iDynTree::InverseKinematics::setCurrentRobotConfiguration
          (InverseKinematics *this,MatrixView<const_double> *baseConfiguration,
          Span<const_double,__1L> jointConfiguration)

{
  index_type iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  MatrixView<const_double> *in_RSI;
  MatrixFixSize<4U,_4U> *in_RDI;
  bool ok;
  int expected_transform_rows;
  int expected_transform_cols;
  MatrixView<const_double> *other;
  MatrixView<const_double> *in_stack_fffffffffffffe40;
  MatrixFixSize *this_00;
  bool local_185;
  VectorDynSize local_168 [32];
  MatrixView<const_double> local_148;
  MatrixFixSize local_118 [128];
  Transform local_98 [103];
  bool local_31;
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 local_18;
  undefined8 uStack_10;
  byte local_1;
  
  local_2c = 4;
  local_30 = 4;
  local_18 = in_RDX;
  uStack_10 = in_RCX;
  iVar1 = MatrixView<const_double>::rows(in_RSI);
  local_185 = false;
  if (iVar1 == 4) {
    iVar1 = MatrixView<const_double>::cols(in_RSI);
    local_185 = iVar1 == 4;
  }
  local_31 = local_185;
  if (local_185 == false) {
    iDynTree::reportError
              ("InverseKinematics","getWorldBaseTransform","Wrong size in input world_T_base");
    local_1 = 0;
  }
  else {
    other = &local_148;
    MatrixView<const_double>::MatrixView(in_stack_fffffffffffffe40,other);
    this_00 = local_118;
    MatrixFixSize<4U,_4U>::MatrixFixSize(in_RDI,in_RSI);
    iDynTree::Transform::Transform(local_98,this_00);
    iDynTree::VectorDynSize::VectorDynSize(local_168,local_18,uStack_10);
    local_1 = setCurrentRobotConfiguration
                        ((InverseKinematics *)this_00,(Transform *)other,(VectorDynSize *)0x169e30);
    iDynTree::VectorDynSize::~VectorDynSize(local_168);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool InverseKinematics::setCurrentRobotConfiguration(iDynTree::MatrixView<const double> baseConfiguration,
                                                         iDynTree::Span<const double> jointConfiguration)
    {
        constexpr int expected_transform_cols = 4;
        constexpr int expected_transform_rows = 4;
        bool ok = (baseConfiguration.rows() == expected_transform_rows)
            && (baseConfiguration.cols() == expected_transform_cols);
        if( !ok )
        {
            reportError("InverseKinematics","getWorldBaseTransform","Wrong size in input world_T_base");
            return false;
        }

        return this->setCurrentRobotConfiguration(Transform(baseConfiguration), jointConfiguration);
    }